

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void init_motion_compensation_hex(search_site_config *cfg,int stride,int level)

{
  uint uVar1;
  FULLPEL_MV FVar2;
  FULLPEL_MV (*paFVar3) [8];
  long lVar4;
  ulong uVar5;
  search_site_config *psVar6;
  int iVar7;
  
  cfg->stride = stride;
  paFVar3 = init_motion_compensation_hex::hex_candidates;
  lVar4 = 0;
  iVar7 = 1;
  psVar6 = cfg;
  do {
    uVar1 = init_motion_compensation_hex::hex_num_candidates[lVar4];
    cfg->searches_per_step[lVar4] = uVar1;
    cfg->radius[lVar4] = iVar7;
    if ((int)uVar1 < 2) {
      uVar1 = 1;
    }
    uVar5 = 0;
    do {
      FVar2 = (*paFVar3)[uVar5];
      psVar6->site[0][uVar5].mv = FVar2;
      psVar6->site[0][uVar5].offset = (int)psVar6->site[0][uVar5].mv.col + FVar2.row * stride;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    iVar7 = iVar7 * 2;
    lVar4 = lVar4 + 1;
    psVar6 = (search_site_config *)(psVar6->site + 1);
    paFVar3 = paFVar3 + 1;
  } while (lVar4 != 0xb);
  cfg->num_search_steps = 0xb;
  return;
}

Assistant:

static void init_motion_compensation_hex(search_site_config *cfg, int stride,
                                         int level) {
  (void)level;
  cfg->stride = stride;
  // First scale has 8-closest points, the rest have 6 points in hex shape
  // at increasing scales.
  static const int hex_num_candidates[MAX_PATTERN_SCALES] = { 8, 6, 6, 6, 6, 6,
                                                              6, 6, 6, 6, 6 };
  // Note that the largest candidate step at each scale is 2^scale.
  /* clang-format off */
    static const FULLPEL_MV
        hex_candidates[MAX_PATTERN_SCALES][MAX_PATTERN_CANDIDATES] = {
        { { -1, -1 }, { 0, -1 }, { 1, -1 }, { 1, 0 }, { 1, 1 }, { 0, 1 },
          { -1, 1 }, { -1, 0 } },
        { { -1, -2 }, { 1, -2 }, { 2, 0 }, { 1, 2 }, { -1, 2 }, { -2, 0 } },
        { { -2, -4 }, { 2, -4 }, { 4, 0 }, { 2, 4 }, { -2, 4 }, { -4, 0 } },
        { { -4, -8 }, { 4, -8 }, { 8, 0 }, { 4, 8 }, { -4, 8 }, { -8, 0 } },
        { { -8, -16 }, { 8, -16 }, { 16, 0 }, { 8, 16 },
          { -8, 16 }, { -16, 0 } },
        { { -16, -32 }, { 16, -32 }, { 32, 0 }, { 16, 32 }, { -16, 32 },
          { -32, 0 } },
        { { -32, -64 }, { 32, -64 }, { 64, 0 }, { 32, 64 }, { -32, 64 },
          { -64, 0 } },
        { { -64, -128 }, { 64, -128 }, { 128, 0 }, { 64, 128 },
          { -64, 128 }, { -128, 0 } },
        { { -128, -256 }, { 128, -256 }, { 256, 0 }, { 128, 256 },
          { -128, 256 }, { -256, 0 } },
        { { -256, -512 }, { 256, -512 }, { 512, 0 }, { 256, 512 },
          { -256, 512 }, { -512, 0 } },
        { { -512, -1024 }, { 512, -1024 }, { 1024, 0 }, { 512, 1024 },
          { -512, 1024 }, { -1024, 0 } },
    };

  /* clang-format on */
  int radius = 1;
  for (int i = 0; i < MAX_PATTERN_SCALES; ++i) {
    cfg->searches_per_step[i] = hex_num_candidates[i];
    cfg->radius[i] = radius;
    for (int j = 0; j < hex_num_candidates[i]; ++j) {
      search_site *const site = &cfg->site[i][j];
      site->mv = hex_candidates[i][j];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    radius *= 2;
  }
  cfg->num_search_steps = MAX_PATTERN_SCALES;
}